

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.h
# Opt level: O3

void __thiscall
wallet::DescriptorScriptPubKeyMan::DescriptorScriptPubKeyMan
          (DescriptorScriptPubKeyMan *this,WalletStorage *storage,WalletDescriptor *descriptor,
          int64_t keypool_size)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int32_t iVar8;
  int32_t iVar9;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  ScriptPubKeyMan::ScriptPubKeyMan(&this->super_ScriptPubKeyMan,storage);
  (this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan =
       (_func_int **)&PTR__DescriptorScriptPubKeyMan_006bd918;
  p_Var1 = &(this->m_map_script_pub_keys)._M_t._M_impl.super__Rb_tree_header;
  (this->m_map_script_pub_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_map_script_pub_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_map_script_pub_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_map_script_pub_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_map_script_pub_keys)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_map_pubkeys)._M_t._M_impl.super__Rb_tree_header;
  (this->m_map_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_map_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_map_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_map_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_map_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_max_cached_index = -1;
  p_Var1 = &(this->m_map_keys)._M_t._M_impl.super__Rb_tree_header;
  (this->m_map_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_map_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_map_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_map_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_map_keys)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_map_crypted_keys)._M_t._M_impl.super__Rb_tree_header;
  (this->m_map_crypted_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_map_crypted_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->m_map_crypted_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_map_crypted_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_map_crypted_keys)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_decryption_thoroughly_checked = false;
  this->m_keypool_size = keypool_size;
  p_Var1 = &(this->m_map_signing_providers)._M_t._M_impl.super__Rb_tree_header;
  (this->m_map_signing_providers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_map_signing_providers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_map_signing_providers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_map_signing_providers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_map_signing_providers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_wallet_descriptor).descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (descriptor->descriptor).super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var3 = (descriptor->descriptor).super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_wallet_descriptor).descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (this->m_wallet_descriptor).next_index = descriptor->next_index;
  uVar4 = *(undefined8 *)(descriptor->id).super_base_blob<256U>.m_data._M_elems;
  uVar5 = *(undefined8 *)((descriptor->id).super_base_blob<256U>.m_data._M_elems + 8);
  uVar6 = *(undefined8 *)((descriptor->id).super_base_blob<256U>.m_data._M_elems + 0x10);
  uVar7 = *(undefined8 *)((descriptor->id).super_base_blob<256U>.m_data._M_elems + 0x18);
  iVar8 = descriptor->range_start;
  iVar9 = descriptor->range_end;
  (this->m_wallet_descriptor).creation_time = descriptor->creation_time;
  (this->m_wallet_descriptor).range_start = iVar8;
  (this->m_wallet_descriptor).range_end = iVar9;
  *(undefined8 *)((this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems + 0x10) =
       uVar6;
  *(undefined8 *)((this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uVar7;
  *(undefined8 *)(this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems = uVar4;
  *(undefined8 *)((this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems + 8) = uVar5;
  DescriptorCache::DescriptorCache(&(this->m_wallet_descriptor).cache,&descriptor->cache);
  *(undefined8 *)
   ((long)&(this->cs_desc_man).super_recursive_mutex.super___recursive_mutex_base._M_mutex + 0x10) =
       0;
  (this->cs_desc_man).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __prev = (__pthread_internal_list *)0x0;
  (this->cs_desc_man).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(this->cs_desc_man).super_recursive_mutex.super___recursive_mutex_base._M_mutex + 8) = 0;
  (this->cs_desc_man).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __next = (__pthread_internal_list *)0x0;
  (this->cs_desc_man).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

DescriptorScriptPubKeyMan(WalletStorage& storage, WalletDescriptor& descriptor, int64_t keypool_size)
        :   ScriptPubKeyMan(storage),
            m_keypool_size(keypool_size),
            m_wallet_descriptor(descriptor)
        {}